

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O3

bool Option::postProcessProject(QMakeProject *project)

{
  QArrayData *pQVar1;
  long lVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  Data *pDVar5;
  qsizetype qVar6;
  Data *pDVar7;
  QString *pQVar8;
  char cVar9;
  ProStringList *pPVar10;
  long in_FS_OFFSET;
  ProKey local_a8;
  ProString local_78;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)&local_78,"QMAKE_EXT_CPP");
  pPVar10 = QMakeEvaluator::valuesRef(&project->super_QMakeEvaluator,(ProKey *)&local_78);
  ProStringList::toQStringList((QStringList *)&local_48,pPVar10);
  qVar6 = local_48.size;
  pQVar8 = local_48.ptr;
  pDVar7 = local_48.d;
  local_a8.super_ProString.m_string.d.size = cpp_ext.d.size;
  local_a8.super_ProString.m_string.d.ptr = (char16_t *)cpp_ext.d.ptr;
  local_a8.super_ProString.m_string.d.d = (Data *)cpp_ext.d.d;
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  cpp_ext.d.d = pDVar7;
  cpp_ext.d.ptr = pQVar8;
  cpp_ext.d.size = qVar6;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey((ProKey *)&local_78,"QMAKE_EXT_H");
  pPVar10 = QMakeEvaluator::valuesRef(&project->super_QMakeEvaluator,(ProKey *)&local_78);
  ProStringList::toQStringList((QStringList *)&local_48,pPVar10);
  qVar6 = local_48.size;
  pQVar8 = local_48.ptr;
  pDVar7 = local_48.d;
  local_a8.super_ProString.m_string.d.size = h_ext.d.size;
  local_a8.super_ProString.m_string.d.ptr = (char16_t *)h_ext.d.ptr;
  local_a8.super_ProString.m_string.d.d = (Data *)h_ext.d.d;
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  h_ext.d.d = pDVar7;
  h_ext.d.ptr = pQVar8;
  h_ext.d.size = qVar6;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey((ProKey *)&local_78,"QMAKE_EXT_C");
  pPVar10 = QMakeEvaluator::valuesRef(&project->super_QMakeEvaluator,(ProKey *)&local_78);
  ProStringList::toQStringList((QStringList *)&local_48,pPVar10);
  qVar6 = local_48.size;
  pQVar8 = local_48.ptr;
  pDVar7 = local_48.d;
  local_a8.super_ProString.m_string.d.size = c_ext.d.size;
  local_a8.super_ProString.m_string.d.ptr = (char16_t *)c_ext.d.ptr;
  local_a8.super_ProString.m_string.d.d = (Data *)c_ext.d.d;
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  c_ext.d.d = pDVar7;
  c_ext.d.ptr = pQVar8;
  c_ext.d.size = qVar6;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_OBJC");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = objc_ext.d.ptr;
  pDVar3 = objc_ext.d.d;
  local_48.d = (Data *)objc_ext.d.d;
  objc_ext.d.d = (Data *)pDVar7;
  objc_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = objc_ext.d.size;
  objc_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_OBJCXX");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = objcpp_ext.d.ptr;
  pDVar3 = objcpp_ext.d.d;
  local_48.d = (Data *)objcpp_ext.d.d;
  objcpp_ext.d.d = (Data *)pDVar7;
  objcpp_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = objcpp_ext.d.size;
  objcpp_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_RES");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = res_ext.d.ptr;
  pDVar3 = res_ext.d.d;
  local_48.d = (Data *)res_ext.d.d;
  res_ext.d.d = (Data *)pDVar7;
  res_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = res_ext.d.size;
  res_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_PKGCONFIG");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = pkgcfg_ext.d.ptr;
  pDVar3 = pkgcfg_ext.d.d;
  local_48.d = (Data *)pkgcfg_ext.d.d;
  pkgcfg_ext.d.d = (Data *)pDVar7;
  pkgcfg_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = pkgcfg_ext.d.size;
  pkgcfg_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_LIBTOOL");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = libtool_ext.d.ptr;
  pDVar3 = libtool_ext.d.d;
  local_48.d = (Data *)libtool_ext.d.d;
  libtool_ext.d.d = (Data *)pDVar7;
  libtool_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = libtool_ext.d.size;
  libtool_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_PRL");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = prl_ext.d.ptr;
  pDVar3 = prl_ext.d.d;
  local_48.d = (Data *)prl_ext.d.d;
  prl_ext.d.d = (Data *)pDVar7;
  prl_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = prl_ext.d.size;
  prl_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_UI");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = ui_ext.d.ptr;
  pDVar3 = ui_ext.d.d;
  local_48.d = (Data *)ui_ext.d.d;
  ui_ext.d.d = (Data *)pDVar7;
  ui_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = ui_ext.d.size;
  ui_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_CPP_MOC");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = cpp_moc_ext.d.ptr;
  pDVar3 = cpp_moc_ext.d.d;
  local_48.d = (Data *)cpp_moc_ext.d.d;
  cpp_moc_ext.d.d = (Data *)pDVar7;
  cpp_moc_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = cpp_moc_ext.d.size;
  cpp_moc_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_LEX");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = lex_ext.d.ptr;
  pDVar3 = lex_ext.d.d;
  local_48.d = (Data *)lex_ext.d.d;
  lex_ext.d.d = (Data *)pDVar7;
  lex_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = lex_ext.d.size;
  lex_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_YACC");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = yacc_ext.d.ptr;
  pDVar3 = yacc_ext.d.d;
  local_48.d = (Data *)yacc_ext.d.d;
  yacc_ext.d.d = (Data *)pDVar7;
  yacc_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = yacc_ext.d.size;
  yacc_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_EXT_OBJ");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = obj_ext.d.ptr;
  pDVar3 = obj_ext.d.d;
  local_48.d = (Data *)obj_ext.d.d;
  obj_ext.d.d = (Data *)pDVar7;
  obj_ext.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = obj_ext.d.size;
  obj_ext.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_H_MOD_MOC");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = h_moc_mod.d.ptr;
  pDVar3 = h_moc_mod.d.d;
  local_48.d = (Data *)h_moc_mod.d.d;
  h_moc_mod.d.d = (Data *)pDVar7;
  h_moc_mod.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = h_moc_mod.d.size;
  h_moc_mod.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_MOD_LEX");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = lex_mod.d.ptr;
  pDVar3 = lex_mod.d.d;
  local_48.d = (Data *)lex_mod.d.d;
  lex_mod.d.d = (Data *)pDVar7;
  lex_mod.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = lex_mod.d.size;
  lex_mod.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_a8,"QMAKE_MOD_YACC");
  QMakeEvaluator::first(&local_78,&project->super_QMakeEvaluator,&local_a8);
  ProString::toQString((QString *)&local_48,&local_78);
  qVar6 = local_48.size;
  pDVar7 = local_48.d;
  pcVar4 = yacc_mod.d.ptr;
  pDVar3 = yacc_mod.d.d;
  local_48.d = (Data *)yacc_mod.d.d;
  yacc_mod.d.d = (Data *)pDVar7;
  yacc_mod.d.ptr = (char16_t *)local_48.ptr;
  local_48.ptr = (QString *)pcVar4;
  local_48.size = yacc_mod.d.size;
  yacc_mod.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProString::ProString(&local_78,&(project->super_QMakeEvaluator).m_dirSep);
  ProString::toQString((QString *)&local_a8,&local_78);
  qVar6 = local_a8.super_ProString.m_string.d.size;
  pDVar5 = local_a8.super_ProString.m_string.d.d;
  pcVar4 = dir_sep.d.ptr;
  pDVar3 = dir_sep.d.d;
  local_a8.super_ProString.m_string.d.d = dir_sep.d.d;
  dir_sep.d.d = pDVar5;
  dir_sep.d.ptr = local_a8.super_ProString.m_string.d.ptr;
  local_a8.super_ProString.m_string.d.ptr = pcVar4;
  local_a8.super_ProString.m_string.d.size = dir_sep.d.size;
  dir_sep.d.size = qVar6;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = &((project->super_QMakeEvaluator).m_buildRoot.d.d)->super_QArrayData;
  lVar2 = (project->super_QMakeEvaluator).m_buildRoot.d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar2 == 0) {
    cVar9 = '\0';
  }
  else {
    local_78.m_string.d.d = (project->super_QMakeEvaluator).m_buildRoot.d.d;
    local_78.m_string.d.ptr = (project->super_QMakeEvaluator).m_buildRoot.d.ptr;
    local_78.m_string.d.size = (project->super_QMakeEvaluator).m_buildRoot.d.size;
    if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.m_string.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.m_string.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    cVar9 = QString::startsWith((QString *)&output_dir,(CaseSensitivity)&local_78);
    if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (cVar9 != '\0') {
    pQVar1 = &((project->super_QMakeEvaluator).m_buildRoot.d.d)->super_QArrayData;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::mid((longlong)&local_78,0x2e5ca8);
    mkfile::cachefile_depth = QString::count((QChar)(char16_t)&local_78,0x2f);
    if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool Option::postProcessProject(QMakeProject *project)
{
    Option::cpp_ext = project->values("QMAKE_EXT_CPP").toQStringList();
    Option::h_ext = project->values("QMAKE_EXT_H").toQStringList();
    Option::c_ext = project->values("QMAKE_EXT_C").toQStringList();
    Option::objc_ext = project->first("QMAKE_EXT_OBJC").toQString();
    Option::objcpp_ext = project->first("QMAKE_EXT_OBJCXX").toQString();
    Option::res_ext = project->first("QMAKE_EXT_RES").toQString();
    Option::pkgcfg_ext = project->first("QMAKE_EXT_PKGCONFIG").toQString();
    Option::libtool_ext = project->first("QMAKE_EXT_LIBTOOL").toQString();
    Option::prl_ext = project->first("QMAKE_EXT_PRL").toQString();
    Option::ui_ext = project->first("QMAKE_EXT_UI").toQString();
    Option::cpp_moc_ext = project->first("QMAKE_EXT_CPP_MOC").toQString();
    Option::lex_ext = project->first("QMAKE_EXT_LEX").toQString();
    Option::yacc_ext = project->first("QMAKE_EXT_YACC").toQString();
    Option::obj_ext = project->first("QMAKE_EXT_OBJ").toQString();
    Option::h_moc_mod = project->first("QMAKE_H_MOD_MOC").toQString();
    Option::lex_mod = project->first("QMAKE_MOD_LEX").toQString();
    Option::yacc_mod = project->first("QMAKE_MOD_YACC").toQString();

    Option::dir_sep = project->dirSep().toQString();

    if (!project->buildRoot().isEmpty() && Option::output_dir.startsWith(project->buildRoot()))
        Option::mkfile::cachefile_depth =
                Option::output_dir.mid(project->buildRoot().size()).count('/');

    return true;
}